

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall httplib::Request::set_header(Request *this,string *key,string *val)

{
  byte bVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  size_type sVar10;
  bool bVar11;
  string *__range2;
  
  sVar3 = key->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (key->_M_dataplus)._M_p;
    sVar10 = 0;
    bVar11 = false;
    do {
      bVar1 = pcVar4[sVar10];
      iVar5 = isalnum((int)(char)bVar1);
      if (iVar5 == 0) {
        uVar6 = (uint)bVar1;
        if ((((0x3f < uVar6 - 0x21) ||
             ((0xe00000000000367dU >> ((ulong)(uVar6 - 0x21) & 0x3f) & 1) == 0)) && (uVar6 != 0x7e))
           && (uVar6 != 0x7c)) break;
      }
      sVar10 = sVar10 + 1;
      bVar11 = sVar3 == sVar10;
    } while (!bVar11);
    if (bVar11) {
      sVar3 = val->_M_string_length;
      if (sVar3 != 0) {
        if (sVar3 == 2) {
          pcVar7 = (val->_M_dataplus)._M_p;
          cVar2 = *pcVar7;
          if (-1 < cVar2 && 0x5d < (byte)(cVar2 - 0x21U)) {
            return;
          }
          pcVar7 = pcVar7 + 1;
        }
        else if (sVar3 == 1) {
          pcVar7 = (val->_M_dataplus)._M_p;
        }
        else {
          pcVar7 = (val->_M_dataplus)._M_p;
          if (-1 < *pcVar7 && 0x5d < (byte)(*pcVar7 - 0x21U)) {
            return;
          }
          uVar9 = 1;
          if (1 < sVar3 - 1) {
            lVar8 = 0;
            do {
              cVar2 = pcVar7[lVar8 + 1];
              if (((cVar2 != '\t') && (cVar2 != ' ')) &&
                 (-1 < cVar2 && 0x5d < (byte)(cVar2 - 0x21U))) {
                return;
              }
              lVar8 = lVar8 + 1;
              uVar9 = sVar3 - 1;
            } while (sVar3 - 2 != lVar8);
          }
          pcVar7 = pcVar7 + uVar9;
        }
        if (-1 < *pcVar7 && 0x5d < (byte)(*pcVar7 - 0x21U)) {
          return;
        }
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,httplib::detail::case_ignore::equal_to,httplib::detail::case_ignore::hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,httplib::detail::case_ignore::equal_to,httplib::detail::case_ignore::hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->headers,0,key);
      return;
    }
  }
  return;
}

Assistant:

inline void Request::set_header(const std::string &key,
                                const std::string &val) {
  if (detail::fields::is_field_name(key) &&
      detail::fields::is_field_value(val)) {
    headers.emplace(key, val);
  }
}